

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yqueue.hpp
# Opt level: O2

chunk_t * zmq::yqueue_t<zmq::command_t,_16>::allocate_chunk(void)

{
  chunk_t *pcVar1;
  
  pcVar1 = (chunk_t *)malloc(0x440);
  return pcVar1;
}

Assistant:

static inline chunk_t *allocate_chunk ()
    {
#ifdef HAVE_POSIX_MEMALIGN
        void *pv;
        if (posix_memalign (&pv, ALIGN, sizeof (chunk_t)) == 0)
            return (chunk_t *) pv;
        return NULL;
#else
        return static_cast<chunk_t *> (malloc (sizeof (chunk_t)));
#endif
    }